

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_send_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  nni_aio *pnVar2;
  ipc_pipe *p;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x608));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 == 0) {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
  }
  else {
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
    if (pnVar2 == aio) {
      nni_aio_abort((nni_aio *)((long)arg + 0xa8),rv);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
    }
    else {
      nni_aio_list_remove(aio);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
      nni_aio_finish_error(aio,rv);
    }
  }
  return;
}

Assistant:

static void
ipc_pipe_send_cancel(nni_aio *aio, void *arg, int rv)
{
	ipc_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	// If this is being sent, then cancel the pending transfer.
	// The callback on the tx_aio will cause the user aio to
	// be canceled too.
	if (nni_list_first(&p->send_q) == aio) {
		nni_aio_abort(&p->tx_aio, rv);
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	nni_mtx_unlock(&p->mtx);

	nni_aio_finish_error(aio, rv);
}